

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidgetPrivate::emitCurrentItemChanged
          (QTableWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  int iVar1;
  int _t4;
  int _t3;
  QTableWidgetItem *pQVar2;
  QTableWidgetItem *pQVar3;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QTableWidgetPrivate *in_RDI;
  QTableWidgetItem *previousItem;
  QTableWidgetItem *currentItem;
  QTableWidget *q;
  QTableWidget *in_stack_ffffffffffffffa8;
  QTableWidgetItem *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  q_func(in_RDI);
  tableModel((QTableWidgetPrivate *)0x8d9a65);
  pQVar2 = QTableModel::item((QTableModel *)in_RDI,
                             (QModelIndex *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  tableModel((QTableWidgetPrivate *)0x8d9a81);
  pQVar3 = QTableModel::item((QTableModel *)in_RDI,
                             (QModelIndex *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if ((pQVar2 != (QTableWidgetItem *)0x0) || (pQVar3 != (QTableWidgetItem *)0x0)) {
    QTableWidget::currentItemChanged
              (in_stack_ffffffffffffffa8,
               (QTableWidgetItem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0);
  }
  iVar1 = QModelIndex::row(in_RSI);
  _t4 = QModelIndex::column(in_RSI);
  _t3 = QModelIndex::row(in_RDX);
  QModelIndex::column(in_RDX);
  QTableWidget::currentCellChanged
            ((QTableWidget *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),(int)((ulong)in_RDI >> 0x20),
             (int)in_RDI,_t3,_t4);
  return;
}

Assistant:

void QTableWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                 const QModelIndex &previous)
{
    Q_Q(QTableWidget);
    QTableWidgetItem *currentItem = tableModel()->item(current);
    QTableWidgetItem *previousItem = tableModel()->item(previous);
    if (currentItem || previousItem)
        emit q->currentItemChanged(currentItem, previousItem);
    emit q->currentCellChanged(current.row(), current.column(), previous.row(), previous.column());
}